

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::FriendlyNameMapper::ParseInstruction
          (FriendlyNameMapper *this,spv_parsed_instruction_t *inst)

{
  uint16_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  uint32_t in_EDX;
  uint32_t id;
  uint32_t id_00;
  uint32_t id_01;
  uint32_t id_02;
  uint32_t id_03;
  uint32_t extraout_EDX;
  bool local_b11;
  string local_a90;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_a70;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_a68;
  string local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  reference local_a00;
  char *c;
  iterator __end3;
  iterator __begin3;
  __string_type *__range3;
  __string_type value_str;
  ostringstream value;
  allocator<char> local_841;
  string local_840;
  allocator<char> local_819;
  string local_818;
  string local_7f8;
  allocator<char> local_7d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  string local_740;
  string local_720;
  allocator<char> local_6f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  allocator<char> local_661;
  string local_660;
  allocator<char> local_639;
  string local_638;
  string local_618;
  allocator<char> local_5f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  string local_5b0;
  allocator<char> local_589;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  string local_548;
  string local_528;
  allocator<char> local_501;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  string local_480;
  allocator<char> local_459;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  string local_418;
  string local_3f8;
  allocator<char> local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  allocator<char> local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  string local_288;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  allocator<char> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  uint32_t local_11c;
  undefined1 local_118 [4];
  uint32_t bit_width_1;
  string local_f8;
  uint local_d4;
  undefined1 local_d0 [4];
  uint32_t bit_width;
  string root;
  string signedness;
  string local_88;
  allocator<char> local_61;
  string local_60;
  string local_40;
  uint32_t local_1c;
  spv_parsed_instruction_t *psStack_18;
  uint32_t result_id;
  spv_parsed_instruction_t *inst_local;
  FriendlyNameMapper *this_local;
  
  uVar2 = inst->result_id;
  uVar1 = inst->opcode;
  local_1c = uVar2;
  psStack_18 = inst;
  inst_local = (spv_parsed_instruction_t *)this;
  if (uVar1 == 5) {
    uVar2 = inst->words[1];
    spvDecodeLiteralStringOperand_abi_cxx11_(&local_40,inst,1);
    SaveName(this,uVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else if (uVar1 == 0x13) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"void",&local_61);
    SaveName(this,uVar2,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  else if (uVar1 == 0x14) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"bool",(allocator<char> *)(signedness.field_2._M_local_buf + 0xf)
              );
    SaveName(this,uVar2,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)(signedness.field_2._M_local_buf + 0xf));
  }
  else if (uVar1 == 0x15) {
    std::__cxx11::string::string((string *)(root.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_d0);
    local_d4 = psStack_18->words[2];
    if (local_d4 == 8) {
      std::__cxx11::string::operator=((string *)local_d0,"char");
    }
    else if (local_d4 == 0x10) {
      std::__cxx11::string::operator=((string *)local_d0,"short");
    }
    else if (local_d4 == 0x20) {
      std::__cxx11::string::operator=((string *)local_d0,"int");
    }
    else if (local_d4 == 0x40) {
      std::__cxx11::string::operator=((string *)local_d0,"long");
    }
    else {
      (anonymous_namespace)::to_string_abi_cxx11_
                (&local_f8,(_anonymous_namespace_ *)(ulong)local_d4,id);
      std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::operator=((string *)(root.field_2._M_local_buf + 8),"i");
    }
    if (psStack_18->words[3] == 0) {
      std::__cxx11::string::operator=((string *)(root.field_2._M_local_buf + 8),"u");
    }
    uVar2 = local_1c;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&root.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    SaveName(this,uVar2,(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)(root.field_2._M_local_buf + 8));
  }
  else if (uVar1 == 0x16) {
    local_11c = inst->words[2];
    if (local_11c == 0x10) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"half",&local_141);
      SaveName(this,uVar2,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    else if (local_11c == 0x20) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"float",&local_169);
      SaveName(this,uVar2,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
    }
    else if (local_11c == 0x40) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"double",&local_191);
      SaveName(this,uVar2,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"fp",&local_1d9);
      (anonymous_namespace)::to_string_abi_cxx11_
                (&local_200,(_anonymous_namespace_ *)(ulong)local_11c,id_00);
      std::operator+(&local_1b8,&local_1d8,&local_200);
      SaveName(this,uVar2,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
    }
  }
  else if (uVar1 == 0x17) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"v",&local_261);
    (anonymous_namespace)::to_string_abi_cxx11_
              (&local_288,(_anonymous_namespace_ *)(ulong)psStack_18->words[3],id_01);
    std::operator+(&local_240,&local_260,&local_288);
    NameForId_abi_cxx11_(&local_2a8,this,psStack_18->words[2]);
    std::operator+(&local_220,&local_240,&local_2a8);
    SaveName(this,uVar2,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
  }
  else if (uVar1 == 0x18) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"mat",&local_309);
    (anonymous_namespace)::to_string_abi_cxx11_
              (&local_330,(_anonymous_namespace_ *)(ulong)psStack_18->words[3],id_02);
    std::operator+(&local_2e8,&local_308,&local_330);
    NameForId_abi_cxx11_(&local_350,this,psStack_18->words[2]);
    std::operator+(&local_2c8,&local_2e8,&local_350);
    SaveName(this,uVar2,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
  }
  else if (uVar1 == 0x1c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"_arr_",&local_3d1);
    NameForId_abi_cxx11_(&local_3f8,this,psStack_18->words[2]);
    std::operator+(&local_3b0,&local_3d0,&local_3f8);
    std::operator+(&local_390,&local_3b0,"_");
    NameForId_abi_cxx11_(&local_418,this,psStack_18->words[3]);
    std::operator+(&local_370,&local_390,&local_418);
    SaveName(this,uVar2,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
  }
  else if (uVar1 == 0x1d) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"_runtimearr_",&local_459);
    NameForId_abi_cxx11_(&local_480,this,psStack_18->words[2]);
    std::operator+(&local_438,&local_458,&local_480);
    SaveName(this,uVar2,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
  }
  else if (uVar1 == 0x1e) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d0,"_struct_",&local_7d1);
    (anonymous_namespace)::to_string_abi_cxx11_
              (&local_7f8,(_anonymous_namespace_ *)(ulong)local_1c,id_03);
    std::operator+(&local_7b0,&local_7d0,&local_7f8);
    SaveName(this,uVar2,&local_7b0);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::allocator<char>::~allocator(&local_7d1);
  }
  else if (uVar1 == 0x1f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"Opaque_",&local_6f9);
    spvDecodeLiteralStringOperand_abi_cxx11_(&local_740,psStack_18,1);
    Sanitize(&local_720,this,&local_740);
    std::operator+(&local_6d8,&local_6f8,&local_720);
    SaveName(this,uVar2,&local_6d8);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator(&local_6f9);
  }
  else if (uVar1 == 0x20) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"_ptr_",&local_501);
    NameForEnumOperand_abi_cxx11_
              (&local_528,this,SPV_OPERAND_TYPE_STORAGE_CLASS,psStack_18->words[2]);
    std::operator+(&local_4e0,&local_500,&local_528);
    std::operator+(&local_4c0,&local_4e0,"_");
    NameForId_abi_cxx11_(&local_548,this,psStack_18->words[3]);
    std::operator+(&local_4a0,&local_4c0,&local_548);
    SaveName(this,uVar2,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator(&local_501);
  }
  else if (uVar1 == 0x22) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"Event",&local_639);
    SaveName(this,uVar2,&local_638);
    std::__cxx11::string::~string((string *)&local_638);
    std::allocator<char>::~allocator(&local_639);
  }
  else if (uVar1 == 0x23) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_660,"DeviceEvent",&local_661);
    SaveName(this,uVar2,&local_660);
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator(&local_661);
  }
  else if (uVar1 == 0x24) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"ReserveId",&local_689);
    SaveName(this,uVar2,&local_688);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator(&local_689);
  }
  else if (uVar1 == 0x25) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"Queue",&local_6b1);
    SaveName(this,uVar2,&local_6b0);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator(&local_6b1);
  }
  else if (uVar1 == 0x26) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"Pipe",&local_5f1);
    NameForEnumOperand_abi_cxx11_
              (&local_618,this,SPV_OPERAND_TYPE_ACCESS_QUALIFIER,psStack_18->words[2]);
    std::operator+(&local_5d0,&local_5f0,&local_618);
    SaveName(this,uVar2,&local_5d0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::allocator<char>::~allocator(&local_5f1);
  }
  else if (uVar1 == 0x29) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"true",&local_819);
    SaveName(this,uVar2,&local_818);
    std::__cxx11::string::~string((string *)&local_818);
    std::allocator<char>::~allocator(&local_819);
  }
  else if (uVar1 == 0x2a) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"false",&local_841);
    SaveName(this,uVar2,&local_840);
    std::__cxx11::string::~string((string *)&local_840);
    std::allocator<char>::~allocator(&local_841);
  }
  else if (uVar1 == 0x2b) {
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)(value_str.field_2._M_local_buf + 8));
    EmitNumericLiteral((ostream *)(value_str.field_2._M_local_buf + 8),psStack_18,
                       psStack_18->operands + 2);
    std::__cxx11::ostringstream::str();
    __end3._M_current = (char *)std::__cxx11::string::begin();
    c = (char *)std::__cxx11::string::end();
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), uVar2 = local_1c, bVar3) {
      local_a00 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end3);
      if (*local_a00 == '-') {
        *local_a00 = 'n';
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    NameForId_abi_cxx11_(&local_a60,this,psStack_18->type_id);
    std::operator+(&local_a40,&local_a60,"_");
    std::operator+(&local_a20,&local_a40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3);
    SaveName(this,uVar2,&local_a20);
    std::__cxx11::string::~string((string *)&local_a20);
    std::__cxx11::string::~string((string *)&local_a40);
    std::__cxx11::string::~string((string *)&local_a60);
    std::__cxx11::string::~string((string *)&__range3);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)(value_str.field_2._M_local_buf + 8));
  }
  else if (uVar1 == 0x47) {
    if (inst->words[2] == 0xb) {
      if (inst->num_words < 4) {
        __assert_fail("inst.num_words > 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/name_mapper.cpp"
                      ,0xb8,
                      "spv_result_t spvtools::FriendlyNameMapper::ParseInstruction(const spv_parsed_instruction_t &)"
                     );
      }
      SaveBuiltInName(this,inst->words[1],inst->words[3]);
    }
  }
  else if (uVar1 == 0x142) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_760,"PipeStorage",&local_761);
    SaveName(this,uVar2,&local_760);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator(&local_761);
  }
  else if (uVar1 == 0x147) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_788,"NamedBarrier",&local_789);
    SaveName(this,uVar2,&local_788);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator(&local_789);
  }
  else if (uVar1 == 0x1141) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"_ptr_",&local_589);
    NameForEnumOperand_abi_cxx11_
              (&local_5b0,this,SPV_OPERAND_TYPE_STORAGE_CLASS,psStack_18->words[2]);
    std::operator+(&local_568,&local_588,&local_5b0);
    SaveName(this,uVar2,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator(&local_589);
  }
  else {
    local_b11 = false;
    if (uVar2 != 0) {
      local_a68._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->name_for_id_,&local_1c);
      local_a70._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->name_for_id_);
      local_b11 = std::__detail::operator==(&local_a68,&local_a70);
      in_EDX = extraout_EDX;
    }
    uVar2 = local_1c;
    if (local_b11 != false) {
      (anonymous_namespace)::to_string_abi_cxx11_
                (&local_a90,(_anonymous_namespace_ *)(ulong)local_1c,in_EDX);
      SaveName(this,uVar2,&local_a90);
      std::__cxx11::string::~string((string *)&local_a90);
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t FriendlyNameMapper::ParseInstruction(
    const spv_parsed_instruction_t& inst) {
  const auto result_id = inst.result_id;
  switch (spv::Op(inst.opcode)) {
    case spv::Op::OpName:
      SaveName(inst.words[1], spvDecodeLiteralStringOperand(inst, 1));
      break;
    case spv::Op::OpDecorate:
      // Decorations come after OpName.  So OpName will take precedence over
      // decorations.
      //
      // In theory, we should also handle OpGroupDecorate.  But that's unlikely
      // to occur.
      if (spv::Decoration(inst.words[2]) == spv::Decoration::BuiltIn) {
        assert(inst.num_words > 3);
        SaveBuiltInName(inst.words[1], inst.words[3]);
      }
      break;
    case spv::Op::OpTypeVoid:
      SaveName(result_id, "void");
      break;
    case spv::Op::OpTypeBool:
      SaveName(result_id, "bool");
      break;
    case spv::Op::OpTypeInt: {
      std::string signedness;
      std::string root;
      const auto bit_width = inst.words[2];
      switch (bit_width) {
        case 8:
          root = "char";
          break;
        case 16:
          root = "short";
          break;
        case 32:
          root = "int";
          break;
        case 64:
          root = "long";
          break;
        default:
          root = to_string(bit_width);
          signedness = "i";
          break;
      }
      if (0 == inst.words[3]) signedness = "u";
      SaveName(result_id, signedness + root);
    } break;
    case spv::Op::OpTypeFloat: {
      const auto bit_width = inst.words[2];
      // TODO: Handle optional fpencoding enum once actually used.
      switch (bit_width) {
        case 16:
          SaveName(result_id, "half");
          break;
        case 32:
          SaveName(result_id, "float");
          break;
        case 64:
          SaveName(result_id, "double");
          break;
        default:
          SaveName(result_id, std::string("fp") + to_string(bit_width));
          break;
      }
    } break;
    case spv::Op::OpTypeVector:
      SaveName(result_id, std::string("v") + to_string(inst.words[3]) +
                              NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypeMatrix:
      SaveName(result_id, std::string("mat") + to_string(inst.words[3]) +
                              NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypeArray:
      SaveName(result_id, std::string("_arr_") + NameForId(inst.words[2]) +
                              "_" + NameForId(inst.words[3]));
      break;
    case spv::Op::OpTypeRuntimeArray:
      SaveName(result_id,
               std::string("_runtimearr_") + NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypePointer:
      SaveName(result_id, std::string("_ptr_") +
                              NameForEnumOperand(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                                 inst.words[2]) +
                              "_" + NameForId(inst.words[3]));
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      SaveName(result_id, std::string("_ptr_") +
                              NameForEnumOperand(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                                 inst.words[2]));
      break;
    case spv::Op::OpTypePipe:
      SaveName(result_id,
               std::string("Pipe") +
                   NameForEnumOperand(SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
                                      inst.words[2]));
      break;
    case spv::Op::OpTypeEvent:
      SaveName(result_id, "Event");
      break;
    case spv::Op::OpTypeDeviceEvent:
      SaveName(result_id, "DeviceEvent");
      break;
    case spv::Op::OpTypeReserveId:
      SaveName(result_id, "ReserveId");
      break;
    case spv::Op::OpTypeQueue:
      SaveName(result_id, "Queue");
      break;
    case spv::Op::OpTypeOpaque:
      SaveName(result_id, std::string("Opaque_") +
                              Sanitize(spvDecodeLiteralStringOperand(inst, 1)));
      break;
    case spv::Op::OpTypePipeStorage:
      SaveName(result_id, "PipeStorage");
      break;
    case spv::Op::OpTypeNamedBarrier:
      SaveName(result_id, "NamedBarrier");
      break;
    case spv::Op::OpTypeStruct:
      // Structs are mapped rather simplisitically. Just indicate that they
      // are a struct and then give the raw Id number.
      SaveName(result_id, std::string("_struct_") + to_string(result_id));
      break;
    case spv::Op::OpConstantTrue:
      SaveName(result_id, "true");
      break;
    case spv::Op::OpConstantFalse:
      SaveName(result_id, "false");
      break;
    case spv::Op::OpConstant: {
      std::ostringstream value;
      EmitNumericLiteral(&value, inst, inst.operands[2]);
      auto value_str = value.str();
      // Use 'n' to signify negative. Other invalid characters will be mapped
      // to underscore.
      for (auto& c : value_str)
        if (c == '-') c = 'n';
      SaveName(result_id, NameForId(inst.type_id) + "_" + value_str);
    } break;
    default:
      // If this instruction otherwise defines an Id, then save a mapping for
      // it.  This is needed to ensure uniqueness in there is an OpName with
      // string something like "1" that might collide with this result_id.
      // We should only do this if a name hasn't already been registered by some
      // previous forward reference.
      if (result_id && name_for_id_.find(result_id) == name_for_id_.end())
        SaveName(result_id, to_string(result_id));
      break;
  }
  return SPV_SUCCESS;
}